

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtop(fitsfile *mfptr,int grpid,fitsfile **gfptr,int *status)

{
  int iVar1;
  char *url [2];
  char comment [73];
  char location2 [1025];
  char local_cc8 [8];
  char location1 [1025];
  char local_8b8 [8];
  char location [1025];
  char *tkeyvalue;
  char keyvalue [1025];
  char local_98 [8];
  char keyword [75];
  long grpExtver;
  long ngroups;
  int found;
  int i;
  int *status_local;
  fitsfile **gfptr_local;
  fitsfile *pfStack_18;
  int grpid_local;
  fitsfile *mfptr_local;
  
  grpExtver = 0;
  stack0xffffffffffffffb8 = 0;
  if (*status == 0) {
    *gfptr = (fitsfile *)0x0;
    _found = status;
    status_local = (int *)gfptr;
    gfptr_local._4_4_ = grpid;
    pfStack_18 = mfptr;
    iVar1 = ffgmng(mfptr,&grpExtver,status);
    *_found = iVar1;
    if (grpExtver < (int)gfptr_local._4_4_) {
      *_found = 0x158;
      snprintf((char *)(url + 1),0x49,"GRPID index %d larger total GRPID keywords %ld (ffgtop)",
               (ulong)gfptr_local._4_4_,grpExtver);
      ffpmsg((char *)(url + 1));
    }
    else {
      snprintf(local_98,0x4b,"GRPID%d",(ulong)gfptr_local._4_4_);
      iVar1 = ffgkyj(pfStack_18,local_98,(long *)(keyword + 0x48),(char *)(url + 1),_found);
      *_found = iVar1;
      if (*_found == 0) {
        if (stack0xffffffffffffffb8 < 1) {
          if (stack0xffffffffffffffb8 == 0) {
            *_found = 0x158;
            snprintf((char *)(url + 1),0x49,"Invalid value of %ld for GRPID%d (ffgtop)",0,
                     (ulong)gfptr_local._4_4_);
            ffpmsg((char *)(url + 1));
          }
          else {
            register0x00000000 = -stack0xffffffffffffffb8;
            snprintf(local_98,0x4b,"GRPLC%d",(ulong)gfptr_local._4_4_);
            iVar1 = ffgkls(pfStack_18,local_98,(char **)(location + 0x400),(char *)(url + 1),_found)
            ;
            *_found = iVar1;
            if (*_found == 0) {
              strcpy((char *)&tkeyvalue,stack0xfffffffffffffb50);
              free(stack0xfffffffffffffb50);
            }
            if (*_found == 0xca) {
              *_found = 0x158;
              snprintf((char *)(url + 1),0x49,"Cannot find GRPLC%d keyword (ffgtop)",
                       (ulong)gfptr_local._4_4_);
              ffpmsg((char *)(url + 1));
            }
            else {
              prepare_keyvalue((char *)&tkeyvalue);
              iVar1 = fits_is_url_absolute((char *)&tkeyvalue);
              if (iVar1 == 0) {
                iVar1 = fits_url2path((char *)&tkeyvalue,local_cc8,_found);
                *_found = iVar1;
                iVar1 = ffopentest(10,(fitsfile **)status_local,local_cc8,1,_found);
                *_found = iVar1;
                if (*_found != 0) {
                  ffpmsg("OK, try open group table file as READONLY (ffgtop)");
                  *_found = 0;
                  iVar1 = ffopentest(10,(fitsfile **)status_local,local_cc8,0,_found);
                  *_found = iVar1;
                  if (*_found != 0) {
                    *_found = 0;
                    url[0] = comment + 0x48;
                    iVar1 = fits_get_url(pfStack_18,local_cc8,url[0],(char *)0x0,(char *)0x0,
                                         (int *)0x0,_found);
                    *_found = iVar1;
                    ngroups._4_4_ = 0;
                    ngroups._0_4_ = 0;
                    status_local[0] = 0;
                    status_local[1] = 0;
                    for (; ngroups._4_4_ < 2 && (int)ngroups == 0; ngroups._4_4_ = ngroups._4_4_ + 1
                        ) {
                      if (*url[(long)ngroups._4_4_ + -1] != '\0') {
                        iVar1 = fits_relurl2url(url[(long)ngroups._4_4_ + -1],(char *)&tkeyvalue,
                                                local_8b8,_found);
                        *_found = iVar1;
                        if (*_found == 0) {
                          iVar1 = fits_is_url_absolute(local_8b8);
                          if (iVar1 == 0) {
                            iVar1 = fits_url2path(local_8b8,url[(long)ngroups._4_4_ + -1],_found);
                            *_found = iVar1;
                            strcpy(local_8b8,url[(long)ngroups._4_4_ + -1]);
                          }
                          iVar1 = ffopentest(10,(fitsfile **)status_local,local_8b8,1,_found);
                          *_found = iVar1;
                          if (*_found != 0) {
                            ffpmsg("opening file as READWRITE failed (ffgtop)");
                            ffpmsg("OK, try to open file as READONLY (ffgtop)");
                            *_found = 0;
                            iVar1 = ffopentest(10,(fitsfile **)status_local,local_8b8,0,_found);
                            *_found = iVar1;
                          }
                          if (*_found == 0) {
                            ngroups._0_4_ = 1;
                          }
                          else {
                            *_found = 0;
                          }
                        }
                        else {
                          *_found = 0;
                        }
                      }
                    }
                  }
                }
              }
              else {
                ffpmsg("Try to open group table file as absolute URL (ffgtop)");
                iVar1 = ffopentest(10,(fitsfile **)status_local,(char *)&tkeyvalue,1,_found);
                *_found = iVar1;
                if (*_found != 0) {
                  ffpmsg("OK, try open group table file as READONLY (ffgtop)");
                  *_found = 0;
                  iVar1 = ffopentest(10,(fitsfile **)status_local,(char *)&tkeyvalue,0,_found);
                  *_found = iVar1;
                }
              }
            }
          }
        }
        else {
          iVar1 = ffreopen(pfStack_18,(fitsfile **)status_local,_found);
          *_found = iVar1;
        }
        if (*_found == 0) {
          if (*(long *)status_local == 0) {
            ffpmsg("Cannot open or find grouping table FITS file (ffgtop)");
            *_found = 0x157;
          }
          else {
            iVar1 = ffmnhd(*(fitsfile **)status_local,-1,"GROUPING",(int)stack0xffffffffffffffb8,
                           _found);
            *_found = iVar1;
            if (*_found != 0) {
              *_found = 0x157;
            }
          }
        }
      }
    }
    if ((*_found != 0) && (*(long *)status_local != 0)) {
      ffclos(*(fitsfile **)status_local,_found);
      status_local[0] = 0;
      status_local[1] = 0;
    }
    mfptr_local._4_4_ = *_found;
  }
  else {
    mfptr_local._4_4_ = *status;
  }
  return mfptr_local._4_4_;
}

Assistant:

int ffgtop(fitsfile *mfptr,  /* FITS file pointer to the member HDU          */
	   int       grpid,  /* group ID (GRPIDn index) within member HDU    */
	   fitsfile **gfptr, /* FITS file pointer to grouping table HDU      */
	   int      *status) /* return status code                           */

/*
  open the grouping table that contains the member HDU. The member HDU must
  be the CHDU of the FITS file pointed to by mfptr, and the grouping table
  is identified by the Nth index number of the GRPIDn keywords specified in 
  the member HDU's header. The fitsfile gfptr pointer is positioned with the
  appropriate FITS file with the grouping table as the CHDU. If the group
  grouping table resides in a file other than the member then an attempt
  is first made to open the file readwrite, and failing that readonly.
 
  Note that it is possible for the GRPIDn/GRPLCn keywords in a member 
  header to be non-continuous, e.g., GRPID1, GRPID2, GRPID5, GRPID6. In 
  such cases, the grpid index value specified in the function call shall
  identify the (grpid)th GRPID value. In the above example, if grpid == 3,
  then the group specified by GRPID5 would be opened.
*/
{
  int i;
  int found;

  long ngroups   = 0;
  long grpExtver = 0;

  char keyword[FLEN_KEYWORD];
  char keyvalue[FLEN_FILENAME];
  char *tkeyvalue;
  char location[FLEN_FILENAME];
  char location1[FLEN_FILENAME];
  char location2[FLEN_FILENAME];
  char comment[FLEN_COMMENT];

  char *url[2];


  if(*status != 0) return(*status);

  do
    {
      /* set the grouping table pointer to NULL for error checking later */

      *gfptr = NULL;

      /*
	make sure that the group ID requested is valid ==> cannot be
	larger than the number of GRPIDn keywords in the member HDU header
      */

      *status = fits_get_num_groups(mfptr,&ngroups,status);

      if(grpid > ngroups)
	{
	  *status = BAD_GROUP_ID;
	  snprintf(comment,FLEN_COMMENT,
		  "GRPID index %d larger total GRPID keywords %ld (ffgtop)",
		  grpid,ngroups);
	  ffpmsg(comment);
	  continue;
	}

      /*
	find the (grpid)th group that the member HDU belongs to and read
	the value of the GRPID(grpid) keyword; fits_get_num_groups()
	automatically re-enumerates the GRPIDn/GRPLCn keywords to fill in
	any gaps
      */

      snprintf(keyword,FLEN_KEYWORD,"GRPID%d",grpid);

      *status = fits_read_key_lng(mfptr,keyword,&grpExtver,comment,status);

      if(*status != 0) continue;

      /*
	if the value of the GRPIDn keyword is positive then the member is
	in the same FITS file as the grouping table and we only have to
	reopen the current FITS file. Else the member and grouping table
	HDUs reside in different files and another FITS file must be opened
	as specified by the corresponding GRPLCn keyword
	
	The DO WHILE loop only executes once and is used to control the
	file opening logic.
      */

      do
	{
	  if(grpExtver > 0) 
	    {
	      /*
		the member resides in the same file as the grouping
		 table, so just reopen the grouping table file
	      */

	      *status = fits_reopen_file(mfptr,gfptr,status);
	      continue;
	    }

	  else if(grpExtver == 0)
	    {
	      /* a GRPIDn value of zero (0) is undefined */

	      *status = BAD_GROUP_ID;
	      snprintf(comment,FLEN_COMMENT,"Invalid value of %ld for GRPID%d (ffgtop)",
		      grpExtver,grpid);
	      ffpmsg(comment);
	      continue;
	    }

	  /* 
	     The GRPLCn keyword value is negative, which implies that
	     the grouping table must reside in another FITS file;
	     search for the corresponding GRPLCn keyword 
	  */
	  
	  /* set the grpExtver value positive */
  
	  grpExtver = -1*grpExtver;

	  /* read the GRPLCn keyword value */

	  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",grpid);
	  /* SPR 1738 */
	  *status = fits_read_key_longstr(mfptr,keyword,&tkeyvalue,comment,
				      status);
	  if (0 == *status) {
	    strcpy(keyvalue,tkeyvalue);
	    free(tkeyvalue);
	  }
	  

	  /* if the GRPLCn keyword was not found then there is a problem */

	  if(*status == KEY_NO_EXIST)
	    {
	      *status = BAD_GROUP_ID;

	      snprintf(comment,FLEN_COMMENT,"Cannot find GRPLC%d keyword (ffgtop)",
		      grpid);
	      ffpmsg(comment);

	      continue;
	    }

	  prepare_keyvalue(keyvalue);

	  /*
	    if the GRPLCn keyword value specifies an absolute URL then
	    try to open the file; we cannot attempt any relative URL
	    or host-dependent file path reconstruction
	  */

	  if(fits_is_url_absolute(keyvalue))
	    {
	      ffpmsg("Try to open group table file as absolute URL (ffgtop)");

	      *status = fits_open_file(gfptr,keyvalue,READWRITE,status);

	      /* if the open was successful then continue */

	      if(*status == 0) continue;

	      /* if READWRITE failed then try opening it READONLY */

	      ffpmsg("OK, try open group table file as READONLY (ffgtop)");
	      
	      *status = 0;
	      *status = fits_open_file(gfptr,keyvalue,READONLY,status);

	      /* continue regardless of the outcome */

	      continue;
	    }

	  /*
	    see if the URL gives a file path that is absolute on the
	    host machine 
	  */

	  *status = fits_url2path(keyvalue,location1,status);

	  *status = fits_open_file(gfptr,location1,READWRITE,status);

	  /* if the file opened then continue */

	  if(*status == 0) continue;

	  /* if READWRITE failed then try opening it READONLY */

	  ffpmsg("OK, try open group table file as READONLY (ffgtop)");
	  
	  *status = 0;
	  *status = fits_open_file(gfptr,location1,READONLY,status);

	  /* if the file opened then continue */

	  if(*status == 0) continue;

	  /*
	    the grouping table location given by GRPLCn must specify a 
	    relative URL. We assume that this URL is relative to the 
	    member HDU's FITS file. Try to construct a full URL location 
	    for the grouping table's FITS file and then open it
	  */

	  *status = 0;
		  
	  /* retrieve the URL information for the member HDU's file */
		  
	  url[0] = location1; url[1] = location2;
		  
	  *status = fits_get_url(mfptr,url[0],url[1],NULL,NULL,NULL,status);

	  /*
	    It is possible that the member HDU file has an initial
	    URL it was opened with and a real URL that the file actually
	    exists at (e.g., an HTTP accessed file copied to a local
	    file). For each possible URL try to construct a
	  */
		  
	  for(i = 0, found = 0, *gfptr = NULL; i < 2 && !found; ++i)
	    {
	      
	      /* the url string could be empty */
	      
	      if(*url[i] == 0) continue;
	      
	      /* 
		 create a full URL from the partial and the member
		 HDU file URL
	      */
	      
	      *status = fits_relurl2url(url[i],keyvalue,location,status);
	      
	      /* if an error occured then contniue */
	      
	      if(*status != 0) 
		{
		  *status = 0;
		  continue;
		}
	      
	      /*
		if the location does not specify an access method
		then turn it into a host dependent path
	      */

	      if(! fits_is_url_absolute(location))
		{
		  *status = fits_url2path(location,url[i],status);
		  strcpy(location,url[i]);
		}
	      
	      /* try to open the grouping table file READWRITE */
	      
	      *status = fits_open_file(gfptr,location,READWRITE,status);
	      
	      if(*status != 0)
		{    
		  /* try to open the grouping table file READONLY */
		  
		  ffpmsg("opening file as READWRITE failed (ffgtop)");
		  ffpmsg("OK, try to open file as READONLY (ffgtop)");
		  *status = 0;
		  *status = fits_open_file(gfptr,location,READONLY,status);
		}
	      
	      /* either set the found flag or reset the status flag */
	      
	      if(*status == 0) 
		found = 1;
	      else
		*status = 0;
	    }

	}while(0); /* end of file opening loop */

      /* if an error occured with the file opening then exit */

      if(*status != 0) continue;
  
      if(*gfptr == NULL)
	{
	  ffpmsg("Cannot open or find grouping table FITS file (ffgtop)");
	  *status = GROUP_NOT_FOUND;
	  continue;
	}

      /* search for the grouping table in its FITS file */

      *status = fits_movnam_hdu(*gfptr,ANY_HDU,"GROUPING",(int)grpExtver,
				status);

      if(*status != 0) *status = GROUP_NOT_FOUND;

    }while(0);

  if(*status != 0 && *gfptr != NULL) 
    {
      fits_close_file(*gfptr,status);
      *gfptr = NULL;
    }

  return(*status);
}